

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O2

bool scp::operator==(BigInt<unsigned_int,_unsigned_long> *x,int64_t y)

{
  int8_t iVar1;
  BigInt<unsigned_int,_unsigned_long> local_30;
  
  BigInt<unsigned_int,_unsigned_long>::BigInt(&local_30,y);
  iVar1 = BigInt<unsigned_int,_unsigned_long>::compare(x,&local_30);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30);
  return iVar1 == '\0';
}

Assistant:

constexpr bool operator==(const BigInt<TBase, TBuffer>& x, int64_t y)
	{
		return x.compare(y) == 0;
	}